

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O3

zt_ptr_array * zt_ptr_array_init(void *args,zt_ptr_array_free_cb free_cb)

{
  zt_ptr_array *__ptr;
  void **ppvVar1;
  
  __ptr = (zt_ptr_array *)zt_calloc_p(1,0x20);
  if (__ptr != (zt_ptr_array *)0x0) {
    __ptr->size = 0x20;
    __ptr->args = args;
    __ptr->free_cb = free_cb;
    ppvVar1 = (void **)zt_malloc_p(0x100);
    __ptr->array = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (zt_ptr_array *)0x0;
}

Assistant:

zt_ptr_array *
zt_ptr_array_init(void * args, zt_ptr_array_free_cb free_cb) {
    zt_ptr_array * array;

    if (!(array = zt_calloc(zt_ptr_array, 1))) {
        return NULL;
    }

    array->size    = ZT_PTR_ARRAY_DEFAULT_SIZE;
    array->args    = args;
    array->free_cb = free_cb;

    if (!(array->array = (void **)zt_malloc(void **, array->size))) {
        zt_free(array);
        return NULL;
    }

    return array;
}